

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O2

bool __thiscall Employee::validate(Employee *this,string *id)

{
  char cVar1;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *__re;
  bool bVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  regex regPattern0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  regex regPattern1;
  
  std::__cxx11::string::string
            ((string *)&local_58,"[8]{1}[4-9]{1}[*]{1}[\\D]{1,2}[0-37-9]{5}",(allocator *)&bStack_98
            );
  std::__cxx11::string::string
            ((string *)&bStack_98,"[9]{1}[0-9]{1}[*]{1}[\\D]{1,2}[0-37-9]{5}",
             (allocator *)&regPattern0);
  __re = &regPattern0;
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)__re,&local_58,0x10);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&regPattern1,&bStack_98,0x10);
  pcVar3 = (char *)(long)*(id->_M_dataplus)._M_p;
  if (*pcVar3 == '9') {
    cVar1 = pcVar3[1];
    __re = &regPattern1;
joined_r0x00111acc:
    if (cVar1 == '\0') {
      bVar2 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (id,__re,0);
      goto LAB_00111add;
    }
  }
  else if (*pcVar3 == '8') {
    cVar1 = pcVar3[1];
    goto joined_r0x00111acc;
  }
  bVar2 = false;
LAB_00111add:
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&regPattern1);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&regPattern0);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_58);
  return bVar2;
}

Assistant:

bool Employee::validate(const string &id) {

    const string &pattern0 = "[8]{1}[4-9]{1}[*]{1}[\\D]{1,2}[0-37-9]{5}";
    const string &pattern1 = "[9]{1}[0-9]{1}[*]{1}[\\D]{1,2}[0-37-9]{5}";
    regex regPattern0(pattern0);
    regex regPattern1(pattern1);
    bool flag = false;
    if (strcmp(reinterpret_cast<const char *>(id[0]), "8") == 0)
    {
        flag = regex_match(id, regPattern0);
    }
    else if (strcmp(reinterpret_cast<const char *>(id[0]), "9") == 0)
    {
        flag = regex_match(id, regPattern1);
    }
    return flag;
}